

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

bool __thiscall ExportDirWrapper::wrap(ExportDirWrapper *this)

{
  int iVar1;
  ExportEntryWrapper *this_00;
  undefined4 extraout_var;
  ExportEntryWrapper *local_50 [3];
  ExportEntryWrapper *local_38;
  ExportEntryWrapper *entry;
  size_t i;
  size_t maxFunc;
  IMAGE_EXPORT_DIRECTORY *exp;
  ExportDirWrapper *this_local;
  
  exp = (IMAGE_EXPORT_DIRECTORY *)this;
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  mapNames(this);
  maxFunc = (size_t)exportDir(this);
  if ((IMAGE_EXPORT_DIRECTORY *)maxFunc == (IMAGE_EXPORT_DIRECTORY *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    i = (size_t)((IMAGE_EXPORT_DIRECTORY *)maxFunc)->NumberOfFunctions;
    for (entry = (ExportEntryWrapper *)0x0; entry < i;
        entry = (ExportEntryWrapper *)
                ((long)&(entry->super_ExeNodeWrapper).super_ExeElementWrapper.
                        super_AbstractByteBuffer._vptr_AbstractByteBuffer + 1)) {
      this_00 = (ExportEntryWrapper *)operator_new(0x40);
      ExportEntryWrapper::ExportEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                         super_ExeElementWrapper.m_Exe,this,(size_t)entry);
      local_38 = this_00;
      iVar1 = (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xc])();
      if (CONCAT44(extraout_var,iVar1) == 0) {
        if (local_38 != (ExportEntryWrapper *)0x0) {
          (*(local_38->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[1])();
        }
        break;
      }
      local_50[0] = local_38;
      std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(value_type *)local_50);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ExportDirWrapper::wrap()
{
    clear();
    mapNames();

    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxFunc = exp->NumberOfFunctions;

    for (size_t i = 0; i < maxFunc; i++) {
        //TODO: build entries...
        ExportEntryWrapper *entry = new ExportEntryWrapper(m_Exe, this, i);
        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
    }
    return true;
}